

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinarySimpleCase::test(ProgramBinarySimpleCase *this)

{
  bool bVar1;
  deUint32 program_00;
  char *pcVar2;
  RenderContext *renderCtx;
  undefined1 local_230 [8];
  ProgramBinary binary;
  ShaderProgram program;
  ProgramSources sources;
  undefined1 local_68 [8];
  string fragSrc;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string vertSrc;
  ProgramBinarySimpleCase *this_local;
  
  vertSrc.field_2._8_8_ = this;
  pcVar2 = anon_unknown_0::getSimpleShaderSource(SHADERTYPE_VERTEX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,pcVar2,&local_31);
  std::allocator<char>::~allocator(&local_31);
  pcVar2 = anon_unknown_0::getSimpleShaderSource(SHADERTYPE_FRAGMENT);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,pcVar2,(allocator<char> *)&sources.field_0xcf);
  std::allocator<char>::~allocator((allocator<char> *)&sources.field_0xcf);
  glu::makeVtxFragSources
            ((ProgramSources *)&program.m_program.m_info.linkTimeUs,(string *)local_30,
             (string *)local_68);
  renderCtx = Context::getRenderContext((this->super_ProgramBinaryCase).super_TestCase.m_context);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)
             &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,renderCtx,
             (ProgramSources *)&program.m_program.m_info.linkTimeUs);
  bVar1 = glu::ShaderProgram::isOk
                    ((ShaderProgram *)
                     &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    anon_unknown_0::ProgramBinary::ProgramBinary((ProgramBinary *)local_230);
    program_00 = glu::ShaderProgram::getProgram
                           ((ShaderProgram *)
                            &binary.data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    ProgramBinaryCase::getProgramBinary
              (&this->super_ProgramBinaryCase,(ProgramBinary *)local_230,program_00);
    ProgramBinaryCase::verifyProgramBinary
              (&this->super_ProgramBinaryCase,(ProgramBinary *)local_230);
    anon_unknown_0::ProgramBinary::~ProgramBinary((ProgramBinary *)local_230);
  }
  glu::ShaderProgram::~ShaderProgram
            ((ShaderProgram *)
             &binary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&program.m_program.m_info.linkTimeUs);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void test (void)
	{
		const std::string			vertSrc	= getSimpleShaderSource(glu::SHADERTYPE_VERTEX);
		const std::string			fragSrc	= getSimpleShaderSource(glu::SHADERTYPE_FRAGMENT);

		const glu::ProgramSources	sources	= glu::makeVtxFragSources(vertSrc, fragSrc);

		glu::ShaderProgram			program	(m_context.getRenderContext(), sources);

		if (program.isOk())
		{
			ProgramBinary binary;

			getProgramBinary(binary, program.getProgram());
			verifyProgramBinary(binary);
		}
	}